

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const*&,unsigned_long_const&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
          (CWriter *this,char **t,unsigned_long *u,char (*args) [2],ExternalInstancePtr *args_1,
          char (*args_2) [9],StackVar *args_3,char (*args_4) [2])

{
  size_t size;
  
  size = strlen((char *)t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,(char *)t,size);
  anon_unknown_0::CWriter::Writef((CWriter *)this,"%u",(ulong)(uint)*u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"(",1);
  anon_unknown_0::CWriter::Write((CWriter *)this,(ExternalInstancePtr *)args);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,", (u64)(",8);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)(ulong)(args_1->super_GlobalName).type)
  ;
  anon_unknown_0::CWriter::WriteData((CWriter *)this,")",1);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }